

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O2

void __thiscall
OpenMD::DLM::rotateStep(DLM *this,int axes1,int axes2,RealType angle,Vector3d *ji,RotMat3x3d *A)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  RotMat3x3d rot;
  Vector3d tempJ;
  RotMat3x3d tempA;
  RectMatrix<double,_3U,_3U> local_120;
  RectMatrix<double,_3U,_3U> local_d8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  RectMatrix<double,_3U,_3U>::operator=(&local_78,(RectMatrix<double,_3U,_3U> *)A);
  local_120.data_[0][0] = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_d8,(double *)&local_120);
  Vector<double,_3U>::Vector(&local_90,(Vector<double,_3U> *)&local_d8);
  SquareMatrix<double,_3>::identity();
  RectMatrix<double,_3U,_3U>::operator=(&local_d8,&local_120);
  dVar3 = cos(angle);
  dVar4 = sin(angle);
  uVar1 = (ulong)(uint)axes1;
  *(double *)((long)local_d8.data_ + uVar1 * 0x20) = dVar3;
  uVar2 = (ulong)(uint)axes2;
  *(double *)((long)local_d8.data_ + uVar2 * 0x20) = dVar3;
  local_d8.data_[uVar1][uVar2] = dVar4;
  local_d8.data_[uVar2][uVar1] = -dVar4;
  operator*((Vector<double,_3U> *)&local_120,&local_d8,&ji->super_Vector<double,_3U>);
  Vector3<double>::operator=(ji,(Vector<double,_3U> *)&local_120);
  operator*((SquareMatrix3<double> *)&local_120,(SquareMatrix3<double> *)&local_d8,A);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)A,&local_120);
  return;
}

Assistant:

void DLM::rotateStep(int axes1, int axes2, RealType angle, Vector3d& ji,
                       RotMat3x3d& A) {
    RealType sinAngle;
    RealType cosAngle;
    // RealType angleSqr;
    // RealType angleSqrOver4;
    // RealType top, bottom;

    RotMat3x3d tempA(A);  // initialize the tempA
    Vector3d tempJ(0.0);

    RotMat3x3d rot = RotMat3x3d::identity();  // initalize rot as a unit matrix

    // use a small angle aproximation for sin and cosine

    // angleSqr = angle * angle;
    // angleSqrOver4 = angleSqr / 4.0;
    // top = 1.0 - angleSqrOver4;
    // bottom = 1.0 + angleSqrOver4;

    // cosAngle = top / bottom;
    // sinAngle = angle / bottom;

    // or don't use the small angle approximation:
    cosAngle          = cos(angle);
    sinAngle          = sin(angle);
    rot(axes1, axes1) = cosAngle;
    rot(axes2, axes2) = cosAngle;

    rot(axes1, axes2) = sinAngle;
    rot(axes2, axes1) = -sinAngle;

    // rotate the momentum acoording to: ji[] = rot[][] * ji[]
    ji = rot * ji;

    // This code comes from converting an algorithm detailed in
    // J. Chem. Phys. 107 (15), pp. 5840-5851 by Dullweber,
    // Leimkuhler and McLachlan (DLM) for use in our code.
    // In Appendix A, the DLM paper has the change to the rotation
    // matrix as: Q = Q * rot.transpose(), but our rotation matrix
    // A is actually equivalent to Q.transpose(). This fact can be
    // seen on page 5849 of the DLM paper where a lab frame
    // dipole \mu_i(t) is expressed in terms of a body-fixed
    // reference orientation, \bar{\mu_i} and the rotation matrix, Q:
    //  \mu_i(t) = Q * \bar{\mu_i}
    // Our code computes lab frame vectors from body-fixed reference
    // vectors using:
    //   v_{lab} = A.transpose() * v_{body}
    //  (See StuntDouble.hpp for confirmation of this fact).
    //
    // So, using the identity:
    //  (A * B).transpose() = B.transpose() * A.transpose(),  we
    // get the equivalent of Q = Q * rot.transpose() for our code to be:

    A = rot * A;
  }